

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode HelAckHandshake(UA_Client *client)

{
  UA_StatusCode UVar1;
  UA_Connection *connection;
  undefined1 local_98 [8];
  UA_TcpAcknowledgeMessage ackMessage;
  UA_Boolean realloced;
  UA_ByteString reply;
  UA_TcpMessageHeader messageHeader;
  size_t offset;
  UA_TcpHelloMessage hello;
  UA_StatusCode retval;
  UA_Connection *conn;
  UA_ByteString message;
  UA_Client *client_local;
  
  connection = &client->connection;
  message.data = (UA_Byte *)client;
  hello.endpointUrl.data._4_4_ =
       (*(client->connection).getSendBuffer)(connection,0x2000,(UA_ByteString *)&conn);
  client_local._4_4_ = hello.endpointUrl.data._4_4_;
  if (hello.endpointUrl.data._4_4_ == 0) {
    UA_String_copy((UA_String *)(message.data + 0xc0),(UA_String *)&hello.maxChunkCount);
    hello.sendBufferSize = (client->connection).localConf.maxChunkCount;
    hello.receiveBufferSize = (client->connection).localConf.maxMessageSize;
    offset._0_4_ = (client->connection).localConf.protocolVersion;
    offset._4_4_ = (client->connection).localConf.recvBufferSize;
    hello.protocolVersion = (client->connection).localConf.sendBufferSize;
    messageHeader.messageTypeAndChunkType = 8;
    messageHeader.messageSize = 0;
    hello.endpointUrl.data._4_4_ =
         UA_TcpHelloMessage_encodeBinary
                   ((UA_TcpHelloMessage *)&offset,(UA_ByteString *)&conn,(size_t *)&messageHeader);
    UA_TcpHelloMessage_deleteMembers((UA_TcpHelloMessage *)&offset);
    reply.data._0_4_ = 0x464c4548;
    reply.data._4_4_ = messageHeader.messageTypeAndChunkType;
    messageHeader.messageTypeAndChunkType = 0;
    messageHeader.messageSize = 0;
    UVar1 = UA_TcpMessageHeader_encodeBinary
                      ((UA_TcpMessageHeader *)&reply.data,(UA_ByteString *)&conn,
                       (size_t *)&messageHeader);
    hello.endpointUrl.data._4_4_ = UVar1 | hello.endpointUrl.data._4_4_;
    if (hello.endpointUrl.data._4_4_ == 0) {
      conn = (UA_Connection *)(ulong)reply.data._4_4_;
      hello.endpointUrl.data._4_4_ = (*(client->connection).send)(connection,(UA_ByteString *)&conn)
      ;
      if (hello.endpointUrl.data._4_4_ == 0) {
        UA_LOG_DEBUG(*(UA_Logger *)(message.data + 0x10),UA_LOGCATEGORY_NETWORK,"Sent HEL message");
        stack0xffffffffffffff80 = 0;
        reply.length = (size_t)(UA_Byte *)0x0;
        ackMessage.maxMessageSize._3_1_ = 0;
        hello.endpointUrl.data._4_4_ =
             UA_Connection_receiveChunksBlocking
                       (connection,(UA_ByteString *)&ackMessage.maxChunkCount,
                        (UA_Boolean *)((long)&ackMessage.maxMessageSize + 3),
                        *(UA_UInt32 *)(message.data + 8));
        if (hello.endpointUrl.data._4_4_ == 0) {
          messageHeader.messageTypeAndChunkType = 0;
          messageHeader.messageSize = 0;
          hello.endpointUrl.data._4_4_ =
               UA_TcpMessageHeader_decodeBinary
                         ((UA_ByteString *)&ackMessage.maxChunkCount,(size_t *)&messageHeader,
                          (UA_TcpMessageHeader *)&reply.data);
          UVar1 = UA_TcpAcknowledgeMessage_decodeBinary
                            ((UA_ByteString *)&ackMessage.maxChunkCount,(size_t *)&messageHeader,
                             (UA_TcpAcknowledgeMessage *)local_98);
          hello.endpointUrl.data._4_4_ = UVar1 | hello.endpointUrl.data._4_4_;
          if ((ackMessage.maxMessageSize._3_1_ & 1) == 0) {
            (*(client->connection).releaseRecvBuffer)
                      (connection,(UA_ByteString *)&ackMessage.maxChunkCount);
          }
          else {
            UA_ByteString_deleteMembers((UA_ByteString *)&ackMessage.maxChunkCount);
          }
          if (hello.endpointUrl.data._4_4_ == 0) {
            UA_LOG_DEBUG(*(UA_Logger *)(message.data + 0x10),UA_LOGCATEGORY_NETWORK,
                         "Received ACK message");
            (client->connection).remoteConf.maxChunkCount = ackMessage.sendBufferSize;
            (client->connection).remoteConf.maxMessageSize = ackMessage.receiveBufferSize;
            (client->connection).remoteConf.protocolVersion = local_98._0_4_;
            (client->connection).remoteConf.sendBufferSize = ackMessage.protocolVersion;
            (client->connection).remoteConf.recvBufferSize = local_98._4_4_;
            if ((client->connection).remoteConf.recvBufferSize <
                (client->connection).localConf.sendBufferSize) {
              (client->connection).localConf.sendBufferSize =
                   (client->connection).remoteConf.recvBufferSize;
            }
            if ((client->connection).remoteConf.sendBufferSize <
                (client->connection).localConf.recvBufferSize) {
              (client->connection).localConf.recvBufferSize =
                   (client->connection).remoteConf.sendBufferSize;
            }
            connection->state = UA_CONNECTION_ESTABLISHED;
          }
          else {
            UA_LOG_INFO(*(UA_Logger *)(message.data + 0x10),UA_LOGCATEGORY_NETWORK,
                        "Decoding ACK message failed");
          }
          UA_TcpAcknowledgeMessage_deleteMembers((UA_TcpAcknowledgeMessage *)local_98);
          client_local._4_4_ = hello.endpointUrl.data._4_4_;
        }
        else {
          UA_LOG_INFO(*(UA_Logger *)(message.data + 0x10),UA_LOGCATEGORY_NETWORK,
                      "Receiving ACK message failed");
          client_local._4_4_ = hello.endpointUrl.data._4_4_;
        }
      }
      else {
        UA_LOG_INFO(*(UA_Logger *)(message.data + 0x10),UA_LOGCATEGORY_NETWORK,"Sending HEL failed")
        ;
        client_local._4_4_ = hello.endpointUrl.data._4_4_;
      }
    }
    else {
      (*(client->connection).releaseSendBuffer)(connection,(UA_ByteString *)&conn);
      client_local._4_4_ = hello.endpointUrl.data._4_4_;
    }
  }
  return client_local._4_4_;
}

Assistant:

static UA_StatusCode
HelAckHandshake(UA_Client *client) {
    /* Get a buffer */
    UA_ByteString message;
    UA_Connection *conn = &client->connection;
    UA_StatusCode retval = conn->getSendBuffer(conn, UA_MINMESSAGESIZE, &message);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Prepare the HEL message and encode at offset 8 */
    UA_TcpHelloMessage hello;
    UA_String_copy(&client->endpointUrl, &hello.endpointUrl); /* must be less than 4096 bytes */
    hello.maxChunkCount = conn->localConf.maxChunkCount;
    hello.maxMessageSize = conn->localConf.maxMessageSize;
    hello.protocolVersion = conn->localConf.protocolVersion;
    hello.receiveBufferSize = conn->localConf.recvBufferSize;
    hello.sendBufferSize = conn->localConf.sendBufferSize;

    size_t offset = 8;
    retval = UA_TcpHelloMessage_encodeBinary(&hello, &message, &offset);
    UA_TcpHelloMessage_deleteMembers(&hello);

    /* Encode the message header at offset 0 */
    UA_TcpMessageHeader messageHeader;
    messageHeader.messageTypeAndChunkType = UA_CHUNKTYPE_FINAL + UA_MESSAGETYPE_HEL;
    messageHeader.messageSize = (UA_UInt32)offset;
    offset = 0;
    retval |= UA_TcpMessageHeader_encodeBinary(&messageHeader, &message, &offset);
    if(retval != UA_STATUSCODE_GOOD) {
        conn->releaseSendBuffer(conn, &message);
        return retval;
    }

    /* Send the HEL message */
    message.length = messageHeader.messageSize;
    retval = conn->send(conn, &message);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_NETWORK,
                    "Sending HEL failed");
        return retval;
    }
    UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_NETWORK,
                 "Sent HEL message");

    /* Loop until we have a complete chunk */
    UA_ByteString reply = UA_BYTESTRING_NULL;
    UA_Boolean realloced = false;
    retval = UA_Connection_receiveChunksBlocking(conn, &reply, &realloced,
                                                 client->config.timeout);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_NETWORK,
                    "Receiving ACK message failed");
        return retval;
    }

    /* Decode the message */
    offset = 0;
    UA_TcpAcknowledgeMessage ackMessage;
    retval = UA_TcpMessageHeader_decodeBinary(&reply, &offset, &messageHeader);
    retval |= UA_TcpAcknowledgeMessage_decodeBinary(&reply, &offset, &ackMessage);

    /* Free the message buffer */
    if(!realloced)
        conn->releaseRecvBuffer(conn, &reply);
    else
        UA_ByteString_deleteMembers(&reply);

    /* Store remote connection settings and adjust local configuration to not
       exceed the limits */
    if(retval == UA_STATUSCODE_GOOD) {
        UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_NETWORK, "Received ACK message");
        conn->remoteConf.maxChunkCount = ackMessage.maxChunkCount; /* may be zero -> unlimited */
        conn->remoteConf.maxMessageSize = ackMessage.maxMessageSize; /* may be zero -> unlimited */
        conn->remoteConf.protocolVersion = ackMessage.protocolVersion;
        conn->remoteConf.sendBufferSize = ackMessage.sendBufferSize;
        conn->remoteConf.recvBufferSize = ackMessage.receiveBufferSize;
        if(conn->remoteConf.recvBufferSize < conn->localConf.sendBufferSize)
            conn->localConf.sendBufferSize = conn->remoteConf.recvBufferSize;
        if(conn->remoteConf.sendBufferSize < conn->localConf.recvBufferSize)
            conn->localConf.recvBufferSize = conn->remoteConf.sendBufferSize;
        conn->state = UA_CONNECTION_ESTABLISHED;
    } else {
        UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_NETWORK, "Decoding ACK message failed");
    }
    UA_TcpAcknowledgeMessage_deleteMembers(&ackMessage);

    return retval;
}